

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IlmThreadProcessGroup.h
# Opt level: O0

Process * __thiscall
IlmThread_3_3::ProcessGroup<Imf_3_3::(anonymous_namespace)::ScanLineProcess,_true>::pop
          (ProcessGroup<Imf_3_3::(anonymous_namespace)::ScanLineProcess,_true> *this)

{
  bool bVar1;
  __pointer_type __p2;
  ostream *this_00;
  void *in_RSI;
  Semaphore *in_RDI;
  atomic<Imf_3_3::(anonymous_namespace)::ScanLineProcess_*> *unaff_retaddr;
  Process *newhead;
  Process *ret;
  atomic<Imf_3_3::(anonymous_namespace)::ScanLineProcess_*> *in_stack_ffffffffffffffe8;
  Semaphore *__p1;
  
  __p1 = in_RDI;
  Semaphore::wait(in_RDI,in_RSI);
  __p2 = std::atomic<Imf_3_3::(anonymous_namespace)::ScanLineProcess_*>::load
                   (in_stack_ffffffffffffffe8,(memory_order)((ulong)in_RDI >> 0x20));
  do {
    if (__p2 == (__pointer_type)0x0) {
      this_00 = std::operator<<((ostream *)&std::cerr,"GACK: serious failure case???");
      std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    }
    bVar1 = std::atomic<Imf_3_3::(anonymous_namespace)::ScanLineProcess_*>::compare_exchange_weak
                      (unaff_retaddr,(__pointer_type *)__p1,__p2,
                       (memory_order)((ulong)__p2->next >> 0x20));
  } while (((bVar1 ^ 0xffU) & 1) != 0);
  return __p2;
}

Assistant:

Process* pop ()
    {
        Process* ret = nullptr;

        // we do not have to worry about ABA problems as
        // we have a static pool of items we own, we're just
        // putting them here and popping them off.

        // used for honoring the numThreads, as pop
        // should only be called by the one thread
        // waiting to submit thread calls
        _sem.wait ();

        ret = _avail_head.load (std::memory_order_acquire);

        Process* newhead;
        do
        {
            if (!ret)
                std::cerr << "GACK: serious failure case???" << std::endl;

            newhead = ret->next;
        } while ( !_avail_head.compare_exchange_weak(
                      ret, newhead, std::memory_order_acquire));

        return ret;
    }